

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMBitLayout.cpp
# Opt level: O2

BitMatrix *
ZXing::DataMatrix::BitMatrixFromCodewords
          (BitMatrix *__return_storage_ptr__,ByteArray *codewords,int width,int height)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int x;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  BitMatrix *pBVar10;
  uint local_128;
  int local_124;
  anon_class_16_2_7c36c2df local_120;
  BitMatrix *local_110;
  ulong local_108;
  BitMatrix result;
  const_iterator codeword;
  BitMatrix visited;
  anon_class_24_3_e7433925 corner;
  anon_class_24_3_e7433925 utah;
  BitPosArray local_70;
  
  local_110 = __return_storage_ptr__;
  BitMatrix::BitMatrix(&result,width,height);
  codeword._M_current =
       (codewords->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_120.codeword = &codeword;
  local_128 = width;
  local_124 = height;
  local_120.result = &result;
  BitMatrix::BitMatrix(&visited,width,height);
  corner.numRows = &local_124;
  uVar6 = 0;
  iVar7 = 4;
  corner.numCols = (int *)&local_128;
  corner.logAccess.visited = &visited;
  utah.numRows = corner.numRows;
  utah.numCols = (int *)&local_128;
  utah.logAccess.visited = &visited;
  iVar4 = height;
  uVar3 = width;
  do {
    iVar5 = (int)uVar6;
    if (iVar7 == iVar4 && iVar5 == 0) {
      VisitMatrix<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/huycn[P]zxing-cpp/core/src/datamatrix/DMBitLayout.cpp:128:44)>
      ::anon_class_24_3_e7433925::operator()(&local_70,&corner,(BitPosArray *)&DAT_0019bd84);
      BitMatrixFromCodewords::anon_class_16_2_7c36c2df::operator()(&local_120,&local_70);
    }
    else {
      bVar2 = iVar4 + -2 != iVar7;
      if ((uVar3 & 3) == 0 || (bVar2 || iVar5 != 0)) {
        if ((uVar3 & 7) == 0 && (iVar5 == 2 && iVar4 + 4 == iVar7)) {
          VisitMatrix<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/huycn[P]zxing-cpp/core/src/datamatrix/DMBitLayout.cpp:128:44)>
          ::anon_class_24_3_e7433925::operator()(&local_70,&corner,(BitPosArray *)&DAT_0019be04);
          BitMatrixFromCodewords::anon_class_16_2_7c36c2df::operator()(&local_120,&local_70);
        }
        else if ((!bVar2 && iVar5 == 0) && (uVar3 & 0x80000007) == 4) {
          VisitMatrix<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/huycn[P]zxing-cpp/core/src/datamatrix/DMBitLayout.cpp:128:44)>
          ::anon_class_24_3_e7433925::operator()(&local_70,&corner,(BitPosArray *)&DAT_0019be44);
          BitMatrixFromCodewords::anon_class_16_2_7c36c2df::operator()(&local_120,&local_70);
        }
      }
      else {
        VisitMatrix<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/huycn[P]zxing-cpp/core/src/datamatrix/DMBitLayout.cpp:128:44)>
        ::anon_class_24_3_e7433925::operator()(&local_70,&corner,(BitPosArray *)&DAT_0019bdc4);
        BitMatrixFromCodewords::anon_class_16_2_7c36c2df::operator()(&local_120,&local_70);
      }
    }
    local_108 = uVar6;
    iVar4 = iVar7;
    iVar5 = -2;
    iVar1 = 5;
    do {
      iVar9 = iVar1;
      iVar8 = iVar5;
      x = (int)uVar6;
      if (-1 < x && iVar4 < local_124) {
        bVar2 = BitMatrix::get(&visited,x,iVar4);
        if (!bVar2) {
          VisitMatrix<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/huycn[P]zxing-cpp/core/src/datamatrix/DMBitLayout.cpp:128:44)>
          ::anon_class_24_3_e7433925::operator()(&local_70,&utah,iVar4,x);
          BitMatrixFromCodewords::anon_class_16_2_7c36c2df::operator()(&local_120,&local_70);
        }
      }
      if (iVar4 < 2) break;
      iVar4 = iVar4 + -2;
      uVar6 = (ulong)(x + 2U);
      iVar5 = iVar8 + -2;
      iVar1 = iVar9 + 2;
    } while ((int)(x + 2U) < (int)local_128);
    do {
      iVar4 = (int)local_108 + iVar9;
      iVar5 = iVar7 + iVar8 + 1;
      if ((-1 < iVar5) && (iVar4 < (int)local_128)) {
        bVar2 = BitMatrix::get(&visited,iVar4,iVar5);
        if (!bVar2) {
          VisitMatrix<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/huycn[P]zxing-cpp/core/src/datamatrix/DMBitLayout.cpp:128:44)>
          ::anon_class_24_3_e7433925::operator()(&local_70,&utah,iVar5,iVar4);
          BitMatrixFromCodewords::anon_class_16_2_7c36c2df::operator()(&local_120,&local_70);
        }
      }
      iVar5 = iVar7 + iVar8;
      iVar8 = iVar8 + 2;
    } while ((iVar5 + 3 < local_124) && (iVar9 = iVar9 + -2, 1 < iVar4));
    iVar7 = iVar7 + iVar8 + 4;
    iVar8 = (int)local_108 - iVar8;
    uVar6 = (ulong)(iVar8 + 4);
    iVar4 = local_124;
    uVar3 = local_128;
    if ((local_124 <= iVar7) && ((int)local_128 < iVar8 + 5)) {
      if (codeword._M_current ==
          (codewords->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar2 = BitMatrix::get(&visited,width + -1,height + -1);
        pBVar10 = local_110;
        if (!bVar2) {
          BitMatrix::set(&result,width + -1,height + -1,true);
          BitMatrix::set(&result,width + -2,height + -2,true);
        }
        pBVar10->_width = result._width;
        pBVar10->_height = result._height;
        (pBVar10->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             result._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        (pBVar10->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             result._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (pBVar10->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             result._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        result._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        result._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        result._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        (local_110->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_110->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_110->_width = 0;
        local_110->_height = 0;
        (local_110->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        pBVar10 = local_110;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&visited._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&result._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return pBVar10;
    }
  } while( true );
}

Assistant:

BitMatrix BitMatrixFromCodewords(const ByteArray& codewords, int width, int height)
{
	BitMatrix result(width, height);

	auto codeword = codewords.begin();

	auto visited = VisitMatrix(height, width, [&codeword, &result](const BitPosArray& bitPos) {
		// Places the 8 bits of a corner or the utah-shaped symbol character in the result matrix
		uint8_t mask = 0x80;
		for (auto& p : bitPos) {
			if (*codeword & mask)
				result.set(p.col, p.row);
			mask >>= 1;
		}
		++codeword;
	});

	if (codeword != codewords.end())
		return {};

	// Lastly, if the lower righthand corner is untouched, fill in fixed pattern
	if (!visited.get(width - 1, height - 1)) {
		result.set(width - 1, height - 1);
		result.set(width - 2, height - 2);
	}

	return result;
}